

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Gia_Man_t * Lf_ManDeriveMappingGia(Lf_Man_t *p)

{
  byte bVar1;
  Jf_Par_t *pJVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Gia_Man_t *p_05;
  char *pcVar9;
  Gia_Obj_t *pObj;
  Lf_Cut_t *pCut;
  word *pwVar10;
  ulong uVar11;
  int Fill;
  long lVar12;
  int iVar13;
  int local_280 [2];
  Vec_Int_t *local_278;
  ulong local_270;
  int pVarsNew [12];
  word pTruthCof [64];
  
  p_00 = Vec_IntStartFull(p->pGia->nObjs);
  pJVar2 = p->pPars;
  p_01 = Vec_IntStart((p->pGia->nObjs + (int)pJVar2->Area) * 2 + (int)pJVar2->Edge +
                      (int)pJVar2->Mux7 * 4);
  p_02 = Vec_IntStart((int)p->pPars->Edge + (int)p->pPars->Area * 2 + 1000);
  p_03 = Vec_IntAlloc(0x10000);
  p_04 = Vec_IntAlloc(0x10);
  if (p->pPars->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x71c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
  }
  p_05 = Gia_ManStart(p->pGia->nObjs);
  pcVar9 = Abc_UtilStrsav(p->pGia->pName);
  p_05->pName = pcVar9;
  pcVar9 = Abc_UtilStrsav(p->pGia->pSpec);
  p_05->pSpec = pcVar9;
  Vec_IntWriteEntry(p_00,0,0);
  iVar13 = 1;
  do {
    if ((p->pGia->nObjs <= iVar13) || (pObj = Gia_ManObj(p->pGia,iVar13), pObj == (Gia_Obj_t *)0x0))
    {
      Vec_IntFree(p_00);
      Vec_IntFree(p_03);
      Vec_IntFree(p_04);
      iVar13 = p_05->nObjs;
      if (iVar13 < p_01->nSize) {
        p_01->nSize = iVar13;
      }
      else {
        Vec_IntFillExtra(p_01,iVar13,Fill);
        iVar13 = p_05->nObjs;
        if (p_01->nSize != iVar13) {
          __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                        ,0x752,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
        }
      }
      for (lVar12 = 0; lVar12 < iVar13; lVar12 = lVar12 + 1) {
        iVar3 = Vec_IntEntry(p_01,(int)lVar12);
        if (0 < iVar3) {
          p_01->pArray[lVar12] = p_01->pArray[lVar12] + p_05->nObjs;
        }
      }
      iVar13 = p_02->nSize;
      iVar3 = 0;
      if (iVar13 < 1) {
        iVar13 = 0;
        iVar3 = 0;
      }
      for (; iVar13 != iVar3; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(p_02,iVar3);
        Vec_IntPush(p_01,iVar4);
      }
      Vec_IntFree(p_02);
      if (p_05->vMapping != (Vec_Int_t *)0x0) {
        __assert_fail("pNew->vMapping == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                      ,0x759,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
      }
      p_05->vMapping = p_01;
      Gia_ManSetRegNum(p_05,p->pGia->nRegs);
      return p_05;
    }
    uVar5 = (uint)*(undefined8 *)pObj;
    if ((~uVar5 & 0x9fffffff) == 0) {
      iVar3 = Gia_ManAppendCi(p_05);
LAB_005c196a:
      Vec_IntWriteEntry(p_00,iVar13,iVar3);
    }
    else if ((~uVar5 & 0x1fffffff) == 0 || -1 < (int)uVar5) {
      iVar3 = Gia_ObjIsBuf(pObj);
      if (iVar3 != 0) {
        iVar3 = Gia_ObjFaninId0p(p->pGia,pObj);
        iVar3 = Vec_IntEntry(p_00,iVar3);
        iVar3 = Abc_LitNotCond(iVar3,*(uint *)pObj >> 0x1d & 1);
        iVar3 = Gia_ManAppendBuf(p_05,iVar3);
        goto LAB_005c196a;
      }
      iVar3 = Lf_ObjMapRefNum(p,iVar13);
      if (iVar3 != 0) {
        pCut = Lf_ObjCutBest(p,iVar13);
        iVar3 = pCut->iFunc;
        if (iVar3 < 0) {
          __assert_fail("pCut->iFunc >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                        ,0x739,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
        }
        uVar5 = *(uint *)&pCut->field_0x14;
        if (uVar5 < 0x1000000) {
          iVar3 = Abc_Lit2Var(iVar3);
          if (iVar3 != 0) {
            __assert_fail("Abc_Lit2Var(pCut->iFunc) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                          ,0x73c,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
          }
          iVar3 = pCut->iFunc;
        }
        else if ((uVar5 & 0xff000000) == 0x1000000) {
          iVar3 = Abc_Lit2Var(iVar3);
          if (iVar3 != 1) {
            __assert_fail("Abc_Lit2Var(pCut->iFunc) == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                          ,0x742,"Gia_Man_t *Lf_ManDeriveMappingGia(Lf_Man_t *)");
          }
          iVar3 = Vec_IntEntry(p_00,(int)pCut[1].Sign);
          iVar4 = Abc_LitIsCompl(pCut->iFunc);
          iVar3 = Abc_LitNotCond(iVar3,iVar4);
        }
        else {
          uVar6 = p->pPars->nLutSizeMux;
          if ((uVar6 == 0) || (uVar6 != uVar5 >> 0x18)) {
            p_04->nSize = 0;
            uVar5 = *(uint *)&pCut->field_0x14;
            if ((uVar5 >> 0x17 & 1) == 0) {
              for (uVar11 = 0; uVar11 < uVar5 >> 0x18; uVar11 = uVar11 + 1) {
                iVar3 = Vec_IntEntry(p_00,*(int *)((long)&pCut[1].Sign + uVar11 * 4));
                Vec_IntPush(p_04,iVar3);
                uVar5 = *(uint *)&pCut->field_0x14;
              }
            }
            else {
              if ((uVar5 & 0xff000000) != 0x3000000) {
                __assert_fail("pCut->nLeaves == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x6fd,
                              "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                             );
              }
              iVar3 = Vec_IntEntry(p_00,(int)pCut[1].Sign);
              iVar3 = Abc_LitNotCond(iVar3,*(uint *)pObj >> 0x1d & 1);
              Vec_IntPush(p_04,iVar3);
              iVar3 = Vec_IntEntry(p_00,*(int *)((long)&pCut[1].Sign + 4));
              iVar3 = Abc_LitNotCond(iVar3,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
              Vec_IntPush(p_04,iVar3);
              iVar3 = Vec_IntEntry(p_00,pCut[1].Delay);
              iVar4 = Gia_ObjFaninC2(p->pGia,pObj);
              iVar3 = Abc_LitNotCond(iVar3,iVar4);
              Vec_IntPush(p_04,iVar3);
            }
            pwVar10 = Lf_CutTruth(p,pCut);
            iVar3 = Kit_TruthToGia(p_05,(uint *)pwVar10,p_04->nSize,p_03,p_04,0);
            iVar4 = Abc_Lit2Var(iVar3);
            Vec_IntSetEntry(p_01,iVar4,p_02->nSize);
            Vec_IntPush(p_02,p_04->nSize);
            for (iVar4 = 0; iVar4 < p_04->nSize; iVar4 = iVar4 + 1) {
              iVar7 = Vec_IntEntry(p_04,iVar4);
              iVar7 = Abc_Lit2Var(iVar7);
              Vec_IntPush(p_02,iVar7);
            }
            uVar5 = *(uint *)&pCut->field_0x14;
            iVar7 = Abc_Lit2Var(iVar3);
            iVar4 = -iVar7;
            if ((uVar5 >> 0x17 & 1) == 0) {
              iVar4 = iVar7;
            }
          }
          else {
            pwVar10 = Lf_CutTruth(p,pCut);
            uVar5 = p->pPars->nLutSize;
            local_270 = (ulong)uVar5;
            iVar3 = 1 << ((char)uVar5 - 6U & 0x1f);
            if ((int)uVar5 < 7) {
              iVar3 = 1;
            }
            uVar5 = Lf_ManFindCofVar(pwVar10,iVar3,(uint)(byte)pCut->field_0x17);
            if (((int)uVar5 < 0) || ((byte)pCut->field_0x17 <= uVar5)) {
              __assert_fail("iVar >= 0 && iVar < (int)pCut->nLeaves",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                            ,0x6d4,
                            "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                           );
            }
            local_278 = p_01;
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              bVar1 = pCut->field_0x17;
              for (uVar11 = 0; bVar1 != uVar11; uVar11 = uVar11 + 1) {
                pVarsNew[uVar11] = (int)uVar11;
              }
              if (lVar12 == 0) {
                Abc_TtCofactor0p(pTruthCof,pwVar10,iVar3,uVar5);
              }
              else {
                Abc_TtCofactor1p(pTruthCof,pwVar10,iVar3,uVar5);
              }
              uVar6 = Abc_TtMinBase(pTruthCof,pVarsNew,(uint)(byte)pCut->field_0x17,(int)local_270);
              if ((int)uVar6 < 1) {
                __assert_fail("nVarsNew > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                              ,0x6de,
                              "int Lf_ManDerivePart(Lf_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Lf_Cut_t *, Vec_Int_t *, Vec_Int_t *, Gia_Obj_t *)"
                             );
              }
              p_04->nSize = 0;
              for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
                iVar4 = Vec_IntEntry(p_00,*(int *)((long)&pCut[1].Sign + (long)pVarsNew[uVar11] * 4)
                                    );
                Vec_IntPush(p_04,iVar4);
              }
              iVar4 = Kit_TruthToGia(p_05,(uint *)pTruthCof,uVar6,p_03,p_04,0);
              local_280[lVar12] = iVar4;
              iVar7 = Abc_Lit2Var(iVar4);
              p_01 = local_278;
              Vec_IntSetEntry(local_278,iVar7,p_02->nSize);
              Vec_IntPush(p_02,p_04->nSize);
              for (iVar7 = 0; iVar7 < p_04->nSize; iVar7 = iVar7 + 1) {
                iVar8 = Vec_IntEntry(p_04,iVar7);
                iVar8 = Abc_Lit2Var(iVar8);
                Vec_IntPush(p_02,iVar8);
              }
              iVar4 = Abc_Lit2Var(iVar4);
              Vec_IntPush(p_02,iVar4);
            }
            pTruthCof[0] = 0xcacacacacacacaca;
            p_04->nSize = 0;
            Vec_IntPush(p_04,local_280[0]);
            Vec_IntPush(p_04,local_280[1]);
            iVar3 = Vec_IntEntry(p_00,*(int *)((long)&pCut[1].Sign + (ulong)uVar5 * 4));
            Vec_IntPush(p_04,iVar3);
            iVar3 = Kit_TruthToGia(p_05,(uint *)pTruthCof,p_04->nSize,p_03,p_04,0);
            iVar4 = Abc_Lit2Var(iVar3);
            Vec_IntSetEntry(p_01,iVar4,p_02->nSize);
            Vec_IntPush(p_02,p_04->nSize);
            for (iVar4 = 0; iVar4 < p_04->nSize; iVar4 = iVar4 + 1) {
              iVar7 = Vec_IntEntry(p_04,iVar4);
              iVar7 = Abc_Lit2Var(iVar7);
              Vec_IntPush(p_02,iVar7);
            }
            iVar4 = Abc_Lit2Var(iVar3);
            iVar4 = -iVar4;
          }
          Vec_IntPush(p_02,iVar4);
          iVar4 = Abc_LitIsCompl(pCut->iFunc);
          iVar3 = Abc_LitNotCond(iVar3,iVar4);
        }
        Vec_IntWriteEntry(p_00,iVar13,iVar3);
      }
    }
    else {
      iVar3 = Gia_ObjFaninId0p(p->pGia,pObj);
      iVar3 = Vec_IntEntry(p_00,iVar3);
      iVar3 = Abc_LitNotCond(iVar3,*(uint *)pObj >> 0x1d & 1);
      Gia_ManAppendCo(p_05,iVar3);
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingGia( Lf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2*Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2*(int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Lf_Cut_t * pCut;
    int i, iLit; 
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachObj1( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntWriteEntry( vCopies, i, Gia_ManAppendCi(pNew) );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
        {
            iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
            iLit = Gia_ManAppendBuf( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        assert( pCut->iFunc >= 0 );
        if ( pCut->nLeaves == 0 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 0 );
            Vec_IntWriteEntry( vCopies, i, pCut->iFunc );
            continue;
        }
        if ( pCut->nLeaves == 1 )
        {
            assert( Abc_Lit2Var(pCut->iFunc) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut->pLeaves[0] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
            continue;
        }
        iLit = Lf_ManDerivePart( p, pNew, vMapping, vMapping2, vCopies, pCut, vLeaves, vCover, pObj );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(pCut->iFunc)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}